

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

char * field_type_str(int type)

{
  char *pcStack_10;
  int type_local;
  
  if (type == 0x100) {
    pcStack_10 = "DT_INT8";
  }
  else if (type == 4) {
    pcStack_10 = "DT_INT16";
  }
  else if (type == 8) {
    pcStack_10 = "DT_INT32";
  }
  else if (type == 0x10) {
    pcStack_10 = "DT_FLOAT32";
  }
  else if (type == -0xfff) {
    pcStack_10 = "NT_DT_STRING";
  }
  else if (type == -0xfef) {
    pcStack_10 = "NT_DT_POINTER";
  }
  else if (type == -0xfee) {
    pcStack_10 = "NT_DT_CHAR_PTR";
  }
  else if (type == -0xfed) {
    pcStack_10 = "NT_DT_EXT_PTR";
  }
  else {
    pcStack_10 = "DT_UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

char * field_type_str( int type )
{
   if( type == DT_INT8 )        return "DT_INT8";
   if( type == DT_INT16 )       return "DT_INT16";
   if( type == DT_INT32 )       return "DT_INT32";
   if( type == DT_FLOAT32 )     return "DT_FLOAT32";
   if( type == NT_DT_STRING )   return "NT_DT_STRING";
   if( type == NT_DT_POINTER )  return "NT_DT_POINTER";
   if( type == NT_DT_CHAR_PTR ) return "NT_DT_CHAR_PTR"; /* longest: 14 */
   if( type == NT_DT_EXT_PTR )  return "NT_DT_EXT_PTR";

   return "DT_UNKNOWN";  /* for DT_UNKNOWN, or as an else */
}